

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O1

string * __thiscall
ki::protocol::dml::MessageTemplate::get_handler_abi_cxx11_
          (string *__return_storage_ptr__,MessageTemplate *this)

{
  Record *this_00;
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar3;
  string local_48;
  
  this_00 = this->m_record;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"_MsgHandler","");
  pFVar3 = ki::dml::Record::get_field<std::__cxx11::string>(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (pFVar3 == (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pbVar2 = &this->m_name;
  }
  else {
    this = (MessageTemplate *)&pFVar3->m_value;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pbVar2 = &pFVar3->m_value;
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string MessageTemplate::get_handler() const
	{
		const auto field = m_record->get_field<ki::dml::STR>("_MsgHandler");
		if (field)
			return field->get_value();
		return m_name;
	}